

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void UtttHashTest(void)

{
  iterator __position;
  pointer pIVar1;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var2;
  _Hash_node_base *p_Var3;
  vector<uttt::IBoard,std::allocator<uttt::IBoard>> *this;
  ostream *poVar4;
  undefined8 uVar5;
  int iVar6;
  vector<long,_std::allocator<long>_> *__range3;
  undefined1 auVar7 [8];
  pointer pIVar8;
  __node_base _Var9;
  _Hash_node_base *p_Var10;
  pair<std::__detail::_Node_iterator<uttt::IBoard,_true,_true>,_bool> pVar11;
  vector<long,_std::allocator<long>_> moves;
  IBoard b2;
  __node_gen_type __node_gen;
  long m;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set2;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set1;
  IBoard board;
  undefined1 local_158 [8];
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> vStack_150;
  uint local_130;
  int local_12c;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_128;
  _Hash_node_base *p_Stack_120;
  _Hash_node_base *local_118;
  undefined1 local_108 [64];
  __node_base local_c8;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_c0;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_b8;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  IBoard local_48;
  
  uttt::IBoard::IBoard(&local_48);
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_108._0_8_ = &local_80;
  pVar11 = std::
           _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
           ::
           _M_insert<uttt::IBoard_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uttt::IBoard,true>>>>
                     ();
  iVar6 = 1;
  uVar5 = CONCAT71(pVar11.first.super__Node_iterator_base<uttt::IBoard,_true>._M_cur._1_7_,1);
  do {
    local_130 = (uint)uVar5;
    local_12c = iVar6;
    _Var9._M_nxt = local_b8._M_before_begin._M_nxt;
    while (_Var9._M_nxt != (_Hash_node_base *)0x0) {
      p_Var10 = (_Var9._M_nxt)->_M_nxt;
      operator_delete(_Var9._M_nxt);
      _Var9._M_nxt = p_Var10;
    }
    memset(local_b8._M_buckets,0,local_b8._M_bucket_count << 3);
    local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b8._M_element_count = 0;
    for (_Var9._M_nxt = local_80._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
        _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
      local_108._16_8_ = _Var9._M_nxt[3]._M_nxt;
      local_108._0_8_ = _Var9._M_nxt[1]._M_nxt;
      local_108._8_8_ = _Var9._M_nxt[2]._M_nxt;
      uttt::IBoard::GetPossibleMoves
                ((vector<long,_std::allocator<long>_> *)local_158,(IBoard *)local_108);
      pIVar8 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var2 = local_128;
      p_Var10 = p_Stack_120;
      p_Var3 = local_118;
      local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_108._0_8_;
      p_Stack_120 = (_Hash_node_base *)local_108._8_8_;
      local_118 = (_Hash_node_base *)local_108._16_8_;
      for (auVar7 = local_158; local_108._0_8_ = local_128, local_108._8_8_ = p_Stack_120,
          local_108._16_8_ = local_118, auVar7 != (undefined1  [8])pIVar8;
          auVar7 = (undefined1  [8])((((pointer)auVar7)->micro)._M_elems + 2)) {
        local_c8._M_nxt = *(_Hash_node_base **)auVar7;
        uttt::IBoard::ApplyMove((IBoard *)&local_128,(IMove *)&local_c8);
        local_c0 = &local_b8;
        std::
        _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<uttt::IBoard_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uttt::IBoard,true>>>>
                  ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_b8,(IBoard *)&local_128,&local_c0);
        p_Var2 = local_128;
        p_Var10 = p_Stack_120;
        p_Var3 = local_118;
        local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_108._0_8_;
        p_Stack_120 = (_Hash_node_base *)local_108._8_8_;
        local_118 = (_Hash_node_base *)local_108._16_8_;
      }
      if (local_158 != (undefined1  [8])0x0) {
        local_128 = p_Var2;
        p_Stack_120 = p_Var10;
        local_118 = p_Var3;
        operator_delete((void *)local_158);
        p_Var2 = local_128;
        p_Var10 = p_Stack_120;
        p_Var3 = local_118;
      }
      local_118 = p_Var3;
      p_Stack_120 = p_Var10;
      local_128 = p_Var2;
    }
    std::
    _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_80,&local_b8);
    local_108._0_8_ = local_108 + 0x30;
    local_108._8_8_ = (_Hash_node_base *)0x1;
    local_108._16_8_ = (_Hash_node_base *)0x0;
    local_108._24_8_ = 0;
    local_108._32_4_ = 1.0;
    local_108._40_8_ = 0;
    local_108._48_8_ = (__node_base_ptr)0x0;
    for (_Var9._M_nxt = local_80._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
        _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
      vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var9._M_nxt[3]._M_nxt;
      local_158 = (undefined1  [8])_Var9._M_nxt[1]._M_nxt;
      vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var9._M_nxt[2]._M_nxt;
      local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)uttt::IBoard::Hash((IBoard *)local_158);
      this = (vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)
             std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_108,(key_type *)&local_128);
      __position._M_current = *(IBoard **)(this + 8);
      if (__position._M_current == *(IBoard **)(this + 0x10)) {
        std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::
        _M_realloc_insert<uttt::IBoard_const&>(this,__position,(IBoard *)local_158);
      }
      else {
        *(pointer *)(((__position._M_current)->micro)._M_elems + 6) =
             vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__position._M_current)->macro = local_158._0_4_;
        ((__position._M_current)->micro)._M_elems[0] = local_158._4_2_;
        ((__position._M_current)->micro)._M_elems[1] = local_158._6_2_;
        *(pointer *)(((__position._M_current)->micro)._M_elems + 2) =
             vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(long *)(this + 8) = *(long *)(this + 8) + 0x18;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"After iteration ",0x10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," set size = ",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_158[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_158,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hashes size = ",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_158[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_158,1);
    for (p_Var10 = (_Hash_node_base *)local_108._16_8_; p_Var10 != (_Hash_node_base *)0x0;
        p_Var10 = p_Var10->_M_nxt) {
      local_158 = (undefined1  [8])p_Var10[1]._M_nxt;
      std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
                (&vStack_150,(vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)(p_Var10 + 2));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hash family: ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_128 = (_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)CONCAT71(local_128._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_128,1);
      pIVar1 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pIVar8 = vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                    _M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar1; pIVar8 = pIVar8 + 1)
      {
        local_118 = *(_Hash_node_base **)((pIVar8->micro)._M_elems + 6);
        local_128 = *(_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      **)pIVar8;
        p_Stack_120 = *(_Hash_node_base **)((pIVar8->micro)._M_elems + 2);
        uttt::IBoard::Print((IBoard *)&local_128);
      }
      if (vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_150.super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_108);
    iVar6 = 2;
    uVar5 = 0;
  } while ((local_130 & 1) != 0);
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_b8);
  std::
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_80);
  return;
}

Assistant:

void
UtttHashTest()
{
    uttt::IBoard board;
    std::unordered_set<uttt::IBoard> set1, set2;
    set1.insert(board);
    for (int i = 0; i < 2; ++i)
    {
        set2.clear();
        for (auto b : set1)
        {
            auto moves = b.GetPossibleMoves();
            for (auto m : moves)
            {
                auto b2 = b;
                b2.ApplyMove(m);
                set2.insert(b2);
            }
        }
        set1 = set2;
        std::unordered_map<std::size_t, std::vector<uttt::IBoard>> hashes;
        for (auto b : set1)
            hashes[b.Hash()].push_back(b);
        std::cout << "After iteration " << i + 1 << " set size = " << set1.size() << '\n';
        std::cout << "hashes size = " << hashes.size() << '\n';

        for (auto it : hashes)
        {
            std::cout << "Hash family: " << it.first << '\n';
            for (auto b : it.second)
                b.Print();
        }
    }
}